

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

shared_ptr<aeron::Subscription> __thiscall
aeron::archive::AeronArchive::replay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<aeron::Subscription> sVar1;
  uint in_stack_00000008;
  code *local_58 [2];
  code *local_48;
  code *local_40;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  local_38[1] = (code *)0x0;
  local_38[0] = defaultOnAvailableImageHandler;
  local_20 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_invoke;
  local_28 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_manager;
  local_58[1] = (code *)0x0;
  local_58[0] = defaultOnUnavailableImageHandler;
  local_40 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_invoke;
  local_48 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_manager;
  replay(this,recordingId,position,length,replayChannel,replayStreamId,
         (on_available_image_t *)(ulong)in_stack_00000008,(on_unavailable_image_t *)local_38);
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::_Function_base::~_Function_base((_Function_base *)local_38);
  sVar1.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar1.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::Subscription> AeronArchive::replay(std::int64_t recordingId, std::int64_t position,
                                                          std::int64_t length, const std::string& replayChannel,
                                                          std::int32_t replayStreamId) {
    return replay(recordingId, position, length, replayChannel, replayStreamId, defaultOnAvailableImageHandler,
                  defaultOnUnavailableImageHandler);
}